

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O0

void __thiscall
duckdb::Transformer::TransformWindowFrame
          (Transformer *this,PGWindowDef *window_spec,WindowExpression *expr)

{
  WindowBoundary WVar1;
  bool bVar2;
  undefined8 uVar3;
  long in_RDX;
  long in_RSI;
  string *in_stack_ffffffffffffff08;
  InternalException *in_stack_ffffffffffffff10;
  allocator *paVar4;
  Transformer *in_stack_ffffffffffffff20;
  optional_ptr<duckdb_libpgquery::PGNode,_true> in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar5;
  allocator in_stack_ffffffffffffff47;
  string *in_stack_ffffffffffffff48;
  ParserException *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [6];
  ExpressionType in_stack_ffffffffffffff76;
  allocator local_59;
  string local_58 [32];
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_38 [2];
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_28 [2];
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr(local_28,*(PGNode **)(in_RSI + 0x30));
  TransformExpression(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             *)in_stack_ffffffffffffff10,
            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             *)in_stack_ffffffffffffff08);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0x1a17c08);
  optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
            (local_38,*(PGNode **)(local_10 + 0x38));
  TransformExpression(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             *)in_stack_ffffffffffffff10,
            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             *)in_stack_ffffffffffffff08);
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)0x1a17c64);
  if (((*(uint *)(local_10 + 0x28) & 0x40) != 0) || ((*(uint *)(local_10 + 0x28) & 0x80) != 0)) {
    uVar3 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_58,
               "Window frames starting with unbounded following or ending in unbounded preceding make no sense"
               ,&local_59);
    InternalException::InternalException(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
  }
  if ((*(uint *)(local_10 + 0x28) & 0x20) == 0) {
    if ((*(uint *)(local_10 + 0x28) & 0x800) == 0) {
      if ((*(uint *)(local_10 + 0x28) & 0x2000) == 0) {
        if ((*(uint *)(local_10 + 0x28) & 0x200) != 0) {
          WVar1 = TransformFrameOption
                            (*(int *)(local_10 + 0x28),CURRENT_ROW_ROWS,CURRENT_ROW_RANGE,
                             CURRENT_ROW_GROUPS);
          *(WindowBoundary *)(local_18 + 0xea) = WVar1;
        }
      }
      else {
        WVar1 = TransformFrameOption
                          (*(int *)(local_10 + 0x28),EXPR_FOLLOWING_ROWS,EXPR_FOLLOWING_RANGE,
                           EXPR_FOLLOWING_GROUPS);
        *(WindowBoundary *)(local_18 + 0xea) = WVar1;
      }
    }
    else {
      WVar1 = TransformFrameOption
                        (*(int *)(local_10 + 0x28),EXPR_PRECEDING_ROWS,EXPR_PRECEDING_RANGE,
                         EXPR_PRECEDING_GROUPS);
      *(WindowBoundary *)(local_18 + 0xea) = WVar1;
    }
  }
  else {
    *(undefined1 *)(local_18 + 0xea) = 1;
  }
  if ((*(uint *)(local_10 + 0x28) & 0x100) == 0) {
    if ((*(uint *)(local_10 + 0x28) & 0x1000) == 0) {
      if ((*(uint *)(local_10 + 0x28) & 0x4000) == 0) {
        if ((*(uint *)(local_10 + 0x28) & 0x400) != 0) {
          WVar1 = TransformFrameOption
                            (*(int *)(local_10 + 0x28),CURRENT_ROW_ROWS,CURRENT_ROW_RANGE,
                             CURRENT_ROW_GROUPS);
          *(WindowBoundary *)(local_18 + 0xeb) = WVar1;
        }
      }
      else {
        WVar1 = TransformFrameOption
                          (*(int *)(local_10 + 0x28),EXPR_FOLLOWING_ROWS,EXPR_FOLLOWING_RANGE,
                           EXPR_FOLLOWING_GROUPS);
        *(WindowBoundary *)(local_18 + 0xeb) = WVar1;
      }
    }
    else {
      WVar1 = TransformFrameOption
                        (*(int *)(local_10 + 0x28),EXPR_PRECEDING_ROWS,EXPR_PRECEDING_RANGE,
                         EXPR_PRECEDING_GROUPS);
      *(WindowBoundary *)(local_18 + 0xeb) = WVar1;
    }
  }
  else {
    *(undefined1 *)(local_18 + 0xeb) = 2;
  }
  if ((((*(uint *)(local_10 + 0x28) & 0x2800) == 0) ||
      (bVar2 = ::std::unique_ptr::operator_cast_to_bool
                         ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x1a17f97), bVar2)) &&
     (((*(uint *)(local_10 + 0x28) & 0x5000) == 0 ||
      (bVar2 = ::std::unique_ptr::operator_cast_to_bool
                         ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           *)0x1a17fca), bVar2)))) {
    if ((*(uint *)(local_10 + 0x28) & 0x8000) == 0) {
      if ((*(uint *)(local_10 + 0x28) & 0x10000) == 0) {
        if ((*(uint *)(local_10 + 0x28) & 0x20000) == 0) {
          *(undefined1 *)(local_18 + 0xec) = 0;
        }
        else {
          *(undefined1 *)(local_18 + 0xec) = 3;
        }
      }
      else {
        *(undefined1 *)(local_18 + 0xec) = 2;
      }
    }
    else {
      *(undefined1 *)(local_18 + 0xec) = 1;
    }
    if (((*(char *)(local_18 + 0xec) != '\0') &&
        (bVar2 = ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::empty
                           ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                            in_stack_ffffffffffffff20), !bVar2)) &&
       (bVar2 = IsExcludableWindowFunction(in_stack_ffffffffffffff76), !bVar2)) {
      uVar5 = 1;
      uVar3 = __cxa_allocate_exception(0x10);
      paVar4 = (allocator *)&stack0xffffffffffffff47;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff48,
                 "EXCLUDE is not supported for the window function \"%s\"",paVar4);
      ::std::__cxx11::string::c_str();
      ParserException::ParserException<char_const*>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (char *)CONCAT17(in_stack_ffffffffffffff47,
                                  CONCAT16(uVar5,in_stack_ffffffffffffff40)));
      __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  paVar4 = &local_91;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_90,"Failed to transform window boundary expression",paVar4);
  InternalException::InternalException(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void Transformer::TransformWindowFrame(duckdb_libpgquery::PGWindowDef &window_spec, WindowExpression &expr) {
	// finally: specifics of bounds
	expr.start_expr = TransformExpression(window_spec.startOffset);
	expr.end_expr = TransformExpression(window_spec.endOffset);

	if ((window_spec.frameOptions & FRAMEOPTION_END_UNBOUNDED_PRECEDING) ||
	    (window_spec.frameOptions & FRAMEOPTION_START_UNBOUNDED_FOLLOWING)) {
		throw InternalException(
		    "Window frames starting with unbounded following or ending in unbounded preceding make no sense");
	}

	if (window_spec.frameOptions & FRAMEOPTION_START_UNBOUNDED_PRECEDING) {
		expr.start = WindowBoundary::UNBOUNDED_PRECEDING;
	} else if (window_spec.frameOptions & FRAMEOPTION_START_OFFSET_PRECEDING) {
		expr.start = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_PRECEDING_ROWS,
		                                  WindowBoundary::EXPR_PRECEDING_RANGE, WindowBoundary::EXPR_PRECEDING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_START_OFFSET_FOLLOWING) {
		expr.start = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_FOLLOWING_ROWS,
		                                  WindowBoundary::EXPR_FOLLOWING_RANGE, WindowBoundary::EXPR_FOLLOWING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_START_CURRENT_ROW) {
		expr.start = TransformFrameOption(window_spec.frameOptions, WindowBoundary::CURRENT_ROW_ROWS,
		                                  WindowBoundary::CURRENT_ROW_RANGE, WindowBoundary::CURRENT_ROW_GROUPS);
	}

	if (window_spec.frameOptions & FRAMEOPTION_END_UNBOUNDED_FOLLOWING) {
		expr.end = WindowBoundary::UNBOUNDED_FOLLOWING;
	} else if (window_spec.frameOptions & FRAMEOPTION_END_OFFSET_PRECEDING) {
		expr.end = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_PRECEDING_ROWS,
		                                WindowBoundary::EXPR_PRECEDING_RANGE, WindowBoundary::EXPR_PRECEDING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_END_OFFSET_FOLLOWING) {
		expr.end = TransformFrameOption(window_spec.frameOptions, WindowBoundary::EXPR_FOLLOWING_ROWS,
		                                WindowBoundary::EXPR_FOLLOWING_RANGE, WindowBoundary::EXPR_FOLLOWING_GROUPS);
	} else if (window_spec.frameOptions & FRAMEOPTION_END_CURRENT_ROW) {
		expr.end = TransformFrameOption(window_spec.frameOptions, WindowBoundary::CURRENT_ROW_ROWS,
		                                WindowBoundary::CURRENT_ROW_RANGE, WindowBoundary::CURRENT_ROW_GROUPS);
	}

	D_ASSERT(expr.start != WindowBoundary::INVALID && expr.end != WindowBoundary::INVALID);
	if (((window_spec.frameOptions & (FRAMEOPTION_START_OFFSET_PRECEDING | FRAMEOPTION_START_OFFSET_FOLLOWING)) &&
	     !expr.start_expr) ||
	    ((window_spec.frameOptions & (FRAMEOPTION_END_OFFSET_PRECEDING | FRAMEOPTION_END_OFFSET_FOLLOWING)) &&
	     !expr.end_expr)) {
		throw InternalException("Failed to transform window boundary expression");
	}

	if (window_spec.frameOptions & FRAMEOPTION_EXCLUDE_CURRENT_ROW) {
		expr.exclude_clause = WindowExcludeMode::CURRENT_ROW;
	} else if (window_spec.frameOptions & FRAMEOPTION_EXCLUDE_GROUP) {
		expr.exclude_clause = WindowExcludeMode::GROUP;
	} else if (window_spec.frameOptions & FRAMEOPTION_EXCLUDE_TIES) {
		expr.exclude_clause = WindowExcludeMode::TIES;
	} else {
		expr.exclude_clause = WindowExcludeMode::NO_OTHER;
	}

	if (expr.exclude_clause != WindowExcludeMode::NO_OTHER && !expr.arg_orders.empty() &&
	    !IsExcludableWindowFunction(expr.type)) {
		throw ParserException("EXCLUDE is not supported for the window function \"%s\"", expr.function_name.c_str());
	}
}